

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_close_comp(int handle)

{
  int iVar1;
  size_t local_18;
  size_t compsize;
  int status;
  int handle_local;
  
  compsize._0_4_ = 0;
  compsize._4_4_ = handle;
  iVar1 = compress2file_from_mem
                    (memTable[handle].memaddr,memTable[handle].fitsfilesize,memTable[handle].fileptr
                     ,&local_18,(int *)&compsize);
  if (iVar1 != 0) {
    ffpmsg("failed to copy memory file to file (mem_close_comp)");
    compsize._0_4_ = 0x6a;
  }
  free(memTable[compsize._4_4_].memaddr);
  memTable[compsize._4_4_].memaddrptr = (char **)0x0;
  memTable[compsize._4_4_].memaddr = (char *)0x0;
  if (memTable[compsize._4_4_].fileptr != _stdout) {
    fclose((FILE *)memTable[compsize._4_4_].fileptr);
  }
  return (int)compsize;
}

Assistant:

int mem_close_comp(int handle)
/*
  compress the memory file, writing it out to the fileptr (which might
  be stdout)
*/
{
    int status = 0;
    size_t compsize;

    /* compress file in  memory to a .gz disk file */

    if(compress2file_from_mem(memTable[handle].memaddr,
              (size_t) (memTable[handle].fitsfilesize), 
              memTable[handle].fileptr,
              &compsize, &status ) )
    {
            ffpmsg("failed to copy memory file to file (mem_close_comp)");
            status = WRITE_ERROR;
    }

    free( memTable[handle].memaddr );   /* free the memory */
    memTable[handle].memaddrptr = 0;
    memTable[handle].memaddr = 0;

    /* close the compressed disk file (except if it is 'stdout' */
    if (memTable[handle].fileptr != stdout)
        fclose(memTable[handle].fileptr);

    return(status);
}